

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_epsv_disable(connectdata *conn)

{
  undefined1 *puVar1;
  int *piVar2;
  CURLcode CVar3;
  
  if ((*(uint *)&(conn->bits).field_0x4 & 0x4440) == 0x400) {
    Curl_failf(conn->data,"Failed EPSV attempt, exiting\n");
    CVar3 = CURLE_WEIRD_SERVER_REPLY;
  }
  else {
    Curl_infof(conn->data,"Failed EPSV attempt. Disabling EPSV\n");
    puVar1 = &(conn->bits).field_0x6;
    *puVar1 = *puVar1 & 0xfd;
    puVar1 = &(conn->data->state).field_0x4e4;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfff7;
    CVar3 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","PASV");
    if (CVar3 == CURLE_OK) {
      piVar2 = &(conn->proto).ftpc.count1;
      *piVar2 = *piVar2 + 1;
      (conn->proto).ftpc.state = FTP_PASV;
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_epsv_disable(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->bits.ipv6 && !(conn->bits.tunnel_proxy || conn->bits.socksproxy)) {
    /* We can't disable EPSV when doing IPv6, so this is instead a fail */
    failf(conn->data, "Failed EPSV attempt, exiting\n");
    return CURLE_WEIRD_SERVER_REPLY;
  }

  infof(conn->data, "Failed EPSV attempt. Disabling EPSV\n");
  /* disable it for next transfer */
  conn->bits.ftp_use_epsv = FALSE;
  conn->data->state.errorbuf = FALSE; /* allow error message to get
                                         rewritten */
  PPSENDF(&conn->proto.ftpc.pp, "%s", "PASV");
  conn->proto.ftpc.count1++;
  /* remain in/go to the FTP_PASV state */
  state(conn, FTP_PASV);
  return result;
}